

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O0

bool bssl::ext_npn_add_clienthello
               (SSL_HANDSHAKE *hs,CBB *out,CBB *out_compressible,ssl_client_hello_type_t type)

{
  SSL *ssl_00;
  int iVar1;
  pointer psVar2;
  SSL *ssl;
  ssl_client_hello_type_t type_local;
  CBB *out_compressible_local;
  CBB *out_local;
  SSL_HANDSHAKE *hs_local;
  
  ssl_00 = hs->ssl;
  psVar2 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::operator->(&ssl_00->ctx);
  if ((((psVar2->next_proto_select_cb !=
         (_func_int_SSL_ptr_uint8_t_ptr_ptr_uint8_t_ptr_uint8_t_ptr_uint_void_ptr *)0x0) &&
       ((*(ushort *)&ssl_00->s3->field_0xdc >> 4 & 1) == 0)) &&
      (iVar1 = SSL_is_dtls(ssl_00), iVar1 == 0)) &&
     ((hs->min_version < 0x304 && (type != ssl_client_hello_inner)))) {
    iVar1 = CBB_add_u16(out,0x3374);
    if ((iVar1 != 0) && (iVar1 = CBB_add_u16(out,0), iVar1 != 0)) {
      return true;
    }
    return false;
  }
  return true;
}

Assistant:

static bool ext_npn_add_clienthello(const SSL_HANDSHAKE *hs, CBB *out,
                                    CBB *out_compressible,
                                    ssl_client_hello_type_t type) {
  const SSL *const ssl = hs->ssl;
  if (ssl->ctx->next_proto_select_cb == NULL ||
      // Do not allow NPN to change on renegotiation.
      ssl->s3->initial_handshake_complete ||
      // NPN is not defined in DTLS or TLS 1.3.
      SSL_is_dtls(ssl) || hs->min_version >= TLS1_3_VERSION ||
      type == ssl_client_hello_inner) {
    return true;
  }

  if (!CBB_add_u16(out, TLSEXT_TYPE_next_proto_neg) ||
      !CBB_add_u16(out, 0 /* length */)) {
    return false;
  }

  return true;
}